

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O2

void __thiscall
FListMenuItemStaticText::FListMenuItemStaticText
          (FListMenuItemStaticText *this,int x,int y,char *text,FFont *font,EColorRange color,
          bool centered)

{
  char *pcVar1;
  
  (this->super_FListMenuItem).mXpos = x;
  (this->super_FListMenuItem).mYpos = y;
  (this->super_FListMenuItem).mAction.Index = 0;
  (this->super_FListMenuItem).mEnabled = true;
  (this->super_FListMenuItem)._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemStaticText_007bf370;
  pcVar1 = ncopystring(text);
  this->mText = pcVar1;
  this->mFont = font;
  this->mColor = color;
  this->mCentered = centered;
  return;
}

Assistant:

FListMenuItemStaticText::FListMenuItemStaticText(int x, int y, const char *text, FFont *font, EColorRange color, bool centered)
: FListMenuItem(x, y)
{
	mText = ncopystring(text);
	mFont = font;
	mColor = color;
	mCentered = centered;
}